

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::JUnitReporter::JUnitTestCaseData::add
          (JUnitTestCaseData *this,string *classname,string *name)

{
  string *name_local;
  string *classname_local;
  JUnitTestCaseData *this_local;
  
  std::
  vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>>
  ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((vector<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>>
              *)this,classname,name);
  return;
}

Assistant:

void add(const std::string& classname, const std::string& name) {
                testcases.emplace_back(classname, name);
            }